

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack7_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar8 = *(undefined1 (*) [16])in;
  auVar11 = vpmovsxbd_avx512f(_DAT_001a0480);
  auVar12 = vpbroadcastd_avx512f(ZEXT416(0x7f));
  uVar3 = in[1];
  auVar13 = vbroadcasti64x4_avx512f(_DAT_00194040);
  uVar1 = in[3];
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  *out = *in & 0x7f;
  uVar4 = *(ulong *)(in + 5);
  auVar11 = vpermd_avx512f(auVar11,ZEXT1664(auVar8));
  auVar7._8_8_ = *(undefined8 *)(in + 2);
  auVar7._0_8_ = *(undefined8 *)(in + 2);
  auVar11 = vpsrlvd_avx512f(auVar11,_DAT_001b2200);
  auVar18 = auVar12._0_16_;
  auVar8 = vpinsrd_avx(auVar18,(uVar3 & 7) << 4,3);
  auVar7 = vpsllvd_avx2(auVar7,_DAT_001a0420);
  auVar5._8_8_ = 0x600000007e;
  auVar5._0_8_ = 0x600000007e;
  auVar7 = vpandq_avx512vl(auVar7,auVar5);
  uVar3 = (uint)(uVar4 >> 0x20);
  auVar13 = vpermi2d_avx512f(auVar13,ZEXT1664(auVar7),ZEXT1664(auVar8));
  auVar14 = vpandd_avx512f(auVar11,auVar12);
  auVar9 = vpbroadcastd_avx512vl();
  auVar11 = vpord_avx512f(auVar11,auVar13);
  auVar13._0_12_ = auVar14._0_12_;
  auVar13._12_4_ = auVar11._12_4_;
  auVar13._16_4_ = auVar14._16_4_;
  auVar13._20_4_ = auVar14._20_4_;
  auVar13._24_4_ = auVar14._24_4_;
  auVar13._28_4_ = auVar14._28_4_;
  auVar13._32_4_ = auVar11._32_4_;
  auVar13._36_4_ = auVar14._36_4_;
  auVar13._40_4_ = auVar14._40_4_;
  auVar13._44_4_ = auVar14._44_4_;
  auVar13._48_4_ = auVar11._48_4_;
  auVar13._52_4_ = auVar14._52_4_;
  auVar13._56_4_ = auVar14._56_4_;
  auVar13._60_4_ = auVar14._60_4_;
  auVar8 = vpinsrd_avx(auVar16,in[4],2);
  uVar2 = *(ulong *)(in + 4);
  auVar10 = vpmovsxbd_avx2(ZEXT816(0xf0e020202020100));
  auVar11 = vmovdqu64_avx512f(auVar13);
  *(undefined1 (*) [64])(out + 1) = auVar11;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar4;
  auVar7 = vpshufd_avx(auVar15,0x40);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar2;
  auVar5 = vpshufd_avx(auVar17,0x50);
  auVar5 = vpsllvd_avx2(auVar5,_DAT_001a0440);
  auVar10 = vpermi2d_avx512vl(auVar10,ZEXT1632(auVar8),auVar9);
  auVar6 = vpsrlvd_avx2(auVar10,_DAT_0019d200);
  auVar8 = vpand_avx(auVar5,_DAT_001a0450);
  auVar10 = vpand_avx2(auVar6,auVar12._0_32_);
  auVar9 = vpermq_avx2(ZEXT1632(auVar8),0xd4);
  auVar9 = vpor_avx2(auVar6,auVar9);
  auVar10 = vpblendd_avx2(auVar10,auVar9,0x22);
  *(undefined1 (*) [32])(out + 0x11) = auVar10;
  auVar5 = vpsrlvd_avx2(auVar7,_DAT_001a0460);
  auVar7 = vpinsrd_avx(auVar18,uVar3 * 8 & 0x78,2);
  auVar8 = vpand_avx(auVar5,auVar18);
  auVar7 = vpor_avx(auVar5,auVar7);
  auVar8 = vpblendd_avx2(auVar8,auVar7,4);
  *(undefined1 (*) [16])(out + 0x19) = auVar8;
  auVar8 = vpbroadcastd_avx512vl();
  auVar8 = vpsrlvd_avx2(auVar8,_DAT_001a0470);
  auVar8 = vpand_avx(auVar8,auVar18);
  *(long *)(out + 0x1d) = auVar8._0_8_;
  out[0x1f] = uVar3 >> 0x19;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack7_32(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 7);
  out++;
  *out = ((*in) >> 7) % (1U << 7);
  out++;
  *out = ((*in) >> 14) % (1U << 7);
  out++;
  *out = ((*in) >> 21) % (1U << 7);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 3)) << (7 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 7);
  out++;
  *out = ((*in) >> 10) % (1U << 7);
  out++;
  *out = ((*in) >> 17) % (1U << 7);
  out++;
  *out = ((*in) >> 24) % (1U << 7);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 6)) << (7 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 7);
  out++;
  *out = ((*in) >> 13) % (1U << 7);
  out++;
  *out = ((*in) >> 20) % (1U << 7);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 2)) << (7 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 7);
  out++;
  *out = ((*in) >> 9) % (1U << 7);
  out++;
  *out = ((*in) >> 16) % (1U << 7);
  out++;
  *out = ((*in) >> 23) % (1U << 7);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 5)) << (7 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 7);
  out++;
  *out = ((*in) >> 12) % (1U << 7);
  out++;
  *out = ((*in) >> 19) % (1U << 7);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 1)) << (7 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 7);
  out++;
  *out = ((*in) >> 8) % (1U << 7);
  out++;
  *out = ((*in) >> 15) % (1U << 7);
  out++;
  *out = ((*in) >> 22) % (1U << 7);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 4)) << (7 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 7);
  out++;
  *out = ((*in) >> 11) % (1U << 7);
  out++;
  *out = ((*in) >> 18) % (1U << 7);
  out++;
  *out = ((*in) >> 25);
  ++in;
  out++;

  return in;
}